

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016c9948;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016c4e58,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016c4b58;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(&this->fGeo,nodeindices);
  lVar1 = 0x3e0;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
     lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoLinear + -3) + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x428);
  for (lVar1 = 0x3e0; lVar1 != 0x428; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoLinear + -3) + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}